

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

uint lyd_list_pos(lyd_node *node)

{
  lys_node *schema;
  lyd_node *plStack_18;
  uint pos;
  lyd_node *node_local;
  
  if ((node == (lyd_node *)0x0) ||
     ((node->schema->nodetype != LYS_LIST && (node->schema->nodetype != LYS_LEAFLIST)))) {
    node_local._4_4_ = 0;
  }
  else {
    schema._4_4_ = 0;
    plStack_18 = node;
    do {
      if (plStack_18->schema == node->schema) {
        schema._4_4_ = schema._4_4_ + 1;
      }
      plStack_18 = plStack_18->prev;
    } while (plStack_18->next != (lyd_node *)0x0);
    node_local._4_4_ = schema._4_4_;
  }
  return node_local._4_4_;
}

Assistant:

API unsigned int
lyd_list_pos(const struct lyd_node *node)
{
    unsigned int pos;
    struct lys_node *schema;

    if (!node || ((node->schema->nodetype != LYS_LIST) && (node->schema->nodetype != LYS_LEAFLIST))) {
        return 0;
    }

    schema = node->schema;
    pos = 0;
    do {
        if (node->schema == schema) {
            ++pos;
        }
        node = node->prev;
    } while (node->next);

    return pos;
}